

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O0

uint __thiscall FuncInfo::AcquireInnerScopeIndex(FuncInfo *this)

{
  uint local_14;
  uint index;
  FuncInfo *this_local;
  
  if (this->currentInnerScopeIndex == 0xffffffff) {
    local_14 = 0;
  }
  else {
    local_14 = this->currentInnerScopeIndex + 1;
    if (local_14 == 0xffffffff) {
      Js::Throw::OutOfMemory();
    }
  }
  if (local_14 == this->innerScopeCount) {
    this->innerScopeCount = local_14 + 1;
  }
  this->currentInnerScopeIndex = local_14;
  return local_14;
}

Assistant:

uint FuncInfo::AcquireInnerScopeIndex()
{
    uint index = this->currentInnerScopeIndex;
    if (index == (uint)-1)
    {
        index = 0;
    }
    else
    {
        index++;
        if (index == (uint)-1)
        {
            Js::Throw::OutOfMemory();
        }
    }
    if (index == this->innerScopeCount)
    {
        this->innerScopeCount = index + 1;
    }
    this->currentInnerScopeIndex = index;
    return index;
}